

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void Benchmark::fill_vector(double *x,double *y,unsigned_long n)

{
  unsigned_long uVar1;
  size_t __i;
  long lVar2;
  ulong uVar3;
  double dVar4;
  mt19937 e2;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  local_13b0._M_x[0] = 0x1571;
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13b0._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b0._M_p = 0x270;
  if (n != 0) {
    do {
      uVar1 = n - 1;
      dVar4 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b0);
      x[n - 1] = dVar4 * 150.0 + 1.0;
      dVar4 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b0);
      y[n - 1] = dVar4 * 150.0 + 1.0;
      n = uVar1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void
Benchmark::fill_vector(double *x, double *y, unsigned long n)
{
	std::mt19937 e2;
	std::uniform_real_distribution<> dist(1, 151);

	while (n--)
	{
		x[n] = dist(e2);
		y[n] = dist(e2);
	}
}